

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::toLower(Catch *this,string *s)

{
  string *s_local;
  string *lc;
  
  std::__cxx11::string::string((string *)this,(string *)s);
  toLowerInPlace((string *)this);
  return this;
}

Assistant:

std::string toLower( std::string const& s ) {
        std::string lc = s;
        toLowerInPlace( lc );
        return lc;
    }